

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.hpp
# Opt level: O1

uint64_t __thiscall time_utils::parse_datetime_json(time_utils *this,char *s)

{
  time_utils tVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  long lVar4;
  int *piVar5;
  system_error *this_00;
  error_category *__ecat;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int local_58 [14];
  
  uVar6 = 0;
  do {
    tVar1 = *this;
    if ((char)tVar1 != 0x2d) {
      if ((byte)((char)tVar1 - 0x3aU) < 0xf6) {
        parse_datetime_json();
        goto LAB_001031c0;
      }
      uVar6 = ((int)(char)tVar1 + uVar6 * 10) - 0x30;
    }
    this = this + 1;
  } while (tVar1 != (time_utils)0x2d);
  uVar7 = 0;
  do {
    tVar1 = *this;
    iVar2 = (int)(char)tVar1;
    if (iVar2 != 0x2d) {
      s = (char *)(ulong)(iVar2 - 0x3aU);
      if ((byte)(iVar2 - 0x3aU) < 0xf6) goto LAB_001031c0;
      uVar7 = (iVar2 + uVar7 * 10) - 0x30;
    }
    this = this + 1;
  } while (tVar1 != (time_utils)0x2d);
  s = (char *)0x0;
  do {
    tVar1 = *this;
    if ((char)tVar1 != 0x54) {
      if ((byte)((char)tVar1 - 0x3aU) < 0xf6) goto LAB_001031c7;
      s = (char *)(ulong)(((int)(char)tVar1 + (int)s * 10) - 0x30);
    }
    this = this + 1;
  } while (tVar1 != (time_utils)0x54);
  uVar9 = 0;
  do {
    tVar1 = *this;
    if ((char)tVar1 != 0x3a) {
      if ((byte)((char)tVar1 - 0x3aU) < 0xf6) goto LAB_001031ce;
      uVar9 = ((int)(char)tVar1 + uVar9 * 10) - 0x30;
    }
    this = this + 1;
  } while (tVar1 != (time_utils)0x3a);
  uVar10 = 0;
  do {
    tVar1 = *this;
    if ((char)tVar1 != 0x3a) {
      if ((byte)((char)tVar1 - 0x3aU) < 0xf6) goto LAB_001031d5;
      uVar10 = ((int)(char)tVar1 + uVar10 * 10) - 0x30;
    }
    this = this + 1;
  } while (tVar1 != (time_utils)0x3a);
  uVar11 = 0;
  do {
    tVar1 = *this;
    if ((char)tVar1 != 0x2e) {
      if ((byte)((char)tVar1 - 0x3aU) < 0xf6) goto LAB_001031dc;
      uVar11 = ((int)(char)tVar1 + uVar11 * 10) - 0x30;
    }
    this = this + 1;
  } while (tVar1 != (time_utils)0x2e);
  uVar12 = 0;
  do {
    tVar1 = *this;
    uVar3 = (uint)(char)tVar1;
    if (uVar3 != 0x5a) {
      if ((byte)((char)tVar1 - 0x3aU) < 0xf6) goto LAB_001031e3;
      uVar12 = (uVar3 + uVar12 * 10) - 0x30;
    }
    this = this + 1;
    if (tVar1 == (time_utils)0x5a) {
      if (uVar6 < 0x7d1) {
        lVar4 = 0;
      }
      else {
        uVar8 = 2000;
        iVar2 = -2000;
        lVar4 = 0;
        do {
          lVar13 = 0x16d;
          if (((uVar8 & 3) == 0) && (lVar13 = 0x16e, (int)(uVar8 / 100) * 100 + iVar2 == 0)) {
            lVar13 = (ulong)((int)(uVar8 / 400) * 400 + iVar2 == 0) + 0x16d;
          }
          lVar4 = lVar4 + lVar13;
          uVar3 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar3;
          iVar2 = iVar2 + -1;
        } while (uVar6 != uVar3);
      }
      local_58[2] = 0x1c;
      if ((uVar6 & 3) == 0) {
        local_58[2] = 0x1d;
        if ((uVar6 * -0x3d70a3d7 >> 2 | uVar6 * 0x40000000) < 0x28f5c29) {
          local_58[2] = ((uVar6 * -0x3d70a3d7 >> 4 | uVar6 * -0x70000000) < 0xa3d70b) + 0x1c;
        }
      }
      local_58[3] = 0x1f;
      local_58[4] = 0x1e;
      local_58[5] = 0x1f;
      local_58[6] = 0x1e;
      local_58[7] = 0x1f;
      local_58[8] = 0x1f;
      local_58[9] = 0x1e;
      local_58[10] = 0x1f;
      local_58[0xb] = 0x1e;
      local_58[0xc] = 0x1f;
      lVar13 = 0;
      if (1 < uVar7) {
        uVar8 = 1;
        do {
          lVar13 = (long)(int)lVar13 + (long)local_58[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      return (ulong)uVar12 +
             ((ulong)uVar11 +
             ((ulong)uVar10 + ((ulong)uVar9 + (lVar4 + (ulong)((int)s - 1) + lVar13) * 0x18) * 0x3c)
             * 0x3c) * 1000000000;
    }
  } while( true );
LAB_001031c0:
  parse_datetime_json();
LAB_001031c7:
  parse_datetime_json();
LAB_001031ce:
  parse_datetime_json();
LAB_001031d5:
  parse_datetime_json();
LAB_001031dc:
  parse_datetime_json();
  uVar3 = extraout_EAX;
LAB_001031e3:
  parse_datetime_json();
  if ((int)uVar3 < 0) {
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    __ecat = (error_category *)std::_V2::generic_category();
    std::system_error::system_error(this_00,iVar2,__ecat,s);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return (ulong)uVar3;
}

Assistant:

static inline
uint64_t parse_datetime_json(const char *s)
{
    const auto year = slurp_digits(s, '-');
    const auto month = slurp_digits(s, '-');
    const auto day = slurp_digits(s, 'T');
    const auto hour = slurp_digits(s, ':');
    const auto minute = slurp_digits(s, ':');
    const auto second = slurp_digits(s, '.');
    const auto nanosecond = slurp_digits(s, 'Z');

    const uint64_t total_days =
        cumulative_days_in_years(2000, year) +
        cumulative_days_in_months_before(year, month) +
        (day - 1);

    uint64_t r = total_days;

    r *= 24;
    r += hour;

    r *= 60;
    r += minute;

    r *= 60;
    r += second;

    r *= 1'000'000'000;
    r += nanosecond;

    return r;
}